

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMFImporter.cpp
# Opt level: O0

void __thiscall
Assimp::AMFImporter::ParseHelper_Node_Enter(AMFImporter *this,CAMFImporter_NodeElement *pNode)

{
  CAMFImporter_NodeElement *local_18;
  CAMFImporter_NodeElement *pNode_local;
  AMFImporter *this_local;
  
  local_18 = pNode;
  pNode_local = (CAMFImporter_NodeElement *)this;
  std::__cxx11::list<CAMFImporter_NodeElement_*,_std::allocator<CAMFImporter_NodeElement_*>_>::
  push_back(&this->mNodeElement_Cur->Child,&local_18);
  this->mNodeElement_Cur = local_18;
  return;
}

Assistant:

void AMFImporter::ParseHelper_Node_Enter(CAMFImporter_NodeElement* pNode)
{
	mNodeElement_Cur->Child.push_back(pNode);// add new element to current element child list.
	mNodeElement_Cur = pNode;// switch current element to new one.
}